

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void __thiscall wasm::Literal::~Literal(Literal *this)

{
  Type *this_00;
  bool bVar1;
  HeapType HVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  if ((this->type).id < 7) {
    return;
  }
  this_00 = &this->type;
  bVar1 = wasm::Type::isNull(this_00);
  if ((((bVar1) || (bVar1 = wasm::Type::isData(this_00), bVar1)) ||
      (HVar2 = wasm::Type::getHeapType(this_00), HVar2.id < 0x7d && ((uint)HVar2.id & 0x7b) == 8))
     || (HVar2 = wasm::Type::getHeapType(this_00),
        ((uint)HVar2.id & 0x7b) == 0x20 && HVar2.id < 0x7d)) {
    this_01 = (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
  }
  else {
    bVar1 = wasm::Type::isExn(this_00);
    this_01 = (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (!bVar1 || this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

Literal::~Literal() {
  // Early exit for the common case; basic types need no special handling.
  if (type.isBasic()) {
    return;
  }
  if (isNull() || isData() || type.getHeapType().isMaybeShared(HeapType::ext) ||
      type.getHeapType().isMaybeShared(HeapType::any)) {
    gcData.~shared_ptr();
  } else if (isExn()) {
    exnData.~shared_ptr();
  }
}